

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdd-for-c.h
# Opt level: O3

int main(void)

{
  __bdd_array__ *p_Var1;
  int iVar2;
  __bdd_array__ *p_Var3;
  char *pcVar4;
  __bdd_node__ *node;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  __bdd_config_type__ config;
  __bdd_config_type__ local_88;
  
  local_88.test_index = 0;
  local_88.location = (char *)0x0;
  local_88.use_color = false;
  local_88.use_tap = false;
  local_88.has_focus_nodes = false;
  local_88._75_5_ = 0;
  local_88.nodes = (__bdd_array__ *)0x0;
  local_88.error = (char *)0x0;
  local_88.current_test = (__bdd_test_step__ *)0x0;
  local_88.node_stack = (__bdd_array__ *)0x0;
  local_88.test_tap_index = 0;
  local_88.failed_test_count = 0;
  local_88.run = __BDD_INIT_RUN__;
  local_88.id = 0;
  p_Var3 = __bdd_array_create__();
  local_88.node_stack = p_Var3;
  local_88.nodes = __bdd_array_create__();
  pcVar4 = getenv("BDD_USE_TAP");
  if (((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) || ((*pcVar4 == '0' && (pcVar4[1] == '\0')))) {
    iVar2 = fileno(_stdout);
    iVar2 = isatty(iVar2);
    if (iVar2 != 0) {
      pcVar4 = getenv("TERM");
      if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
        local_88.use_color = true;
      }
    }
  }
  else {
    local_88.use_tap = true;
  }
  lVar7 = 0;
  node = __bdd_node_create__(-1,__bdd_spec_name__,__BDD_NODE_GROUP__,__bdd_node_flags_none__);
  __bdd_array_push__(p_Var3,node);
  __bdd_test_main__(&local_88);
  p_Var3 = __bdd_array_create__();
  __bdd_node_flatten__(&local_88,node,p_Var3);
  sVar5 = p_Var3->size;
  if (sVar5 != 0) {
    lVar7 = 0;
    sVar6 = 0;
    do {
      lVar7 = lVar7 + (ulong)(*(int *)((long)p_Var3->values[sVar6] + 0x18) == 2);
      sVar6 = sVar6 + 1;
    } while (sVar5 != sVar6);
  }
  if (local_88.use_tap != false) {
    printf("TAP version 13\n1..%zu\n",lVar7);
    sVar5 = p_Var3->size;
  }
  local_88.run = 2;
  if (sVar5 != 0) {
    uVar8 = 0;
    do {
      local_88.current_test = (__bdd_test_step__ *)p_Var3->values[uVar8];
      (local_88.node_stack)->size = 1;
      local_88._0_8_ = local_88._0_8_ & 0xffffffff;
      __bdd_run__(&local_88);
      uVar8 = uVar8 + 1;
    } while (uVar8 < p_Var3->size);
  }
  p_Var1 = local_88.nodes;
  if ((local_88.nodes)->size != 0) {
    uVar8 = 0;
    do {
      __bdd_node_free__((__bdd_node__ *)p_Var1->values[uVar8]);
      uVar8 = uVar8 + 1;
    } while (uVar8 < p_Var1->size);
  }
  node->name = (char *)0x0;
  __bdd_node_free__(node);
  if (p_Var3->size != 0) {
    uVar8 = 0;
    do {
      free(p_Var3->values[uVar8]);
      uVar8 = uVar8 + 1;
    } while (uVar8 < p_Var3->size);
  }
  free(p_Var1->values);
  free(p_Var1);
  p_Var1 = local_88.node_stack;
  free((local_88.node_stack)->values);
  free(p_Var1);
  free(p_Var3->values);
  free(p_Var3);
  if (local_88.failed_test_count == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 1;
    if (local_88.use_tap == false) {
      pcVar4 = "s";
      if (lVar7 == 1) {
        pcVar4 = "";
      }
      printf("\n%zu test%s run, %zu failed.\n",lVar7,pcVar4);
    }
  }
  return iVar2;
}

Assistant:

int main(void) {
    struct __bdd_config_type__ config = {
        .run = __BDD_INIT_RUN__,
        .id = 0,
        .test_index = 0,
        .test_tap_index = 0,
        .failed_test_count = 0,
        .node_stack = __bdd_array_create__(),
        .nodes = __bdd_array_create__(),
        .error = NULL,
        .use_color = 0,
        .use_tap = 0
    };

    const char *tap_env = getenv("BDD_USE_TAP");
    if (BDD_USE_TAP || (tap_env && strcmp(tap_env, "") != 0 && strcmp(tap_env, "0") != 0)) {
        config.use_tap = 1;
    }

    if (!config.use_tap && BDD_USE_COLOR && __BDD_IS_ATTY__() && __bdd_is_supported_term__()) {
        config.use_color = 1;
    }

    __bdd_node__ *root = __bdd_node_create__(-1, __bdd_spec_name__, __BDD_NODE_GROUP__, __bdd_node_flags_none__);
    __bdd_array_push__(config.node_stack, root);

    // During the first run we just gather the
    // count of the tests and their descriptions
    __bdd_test_main__(&config);

    __bdd_array__ *steps = __bdd_array_create__();
    __bdd_node_flatten__(&config, root, steps);

    size_t test_count = 0;
    for (size_t i = 0; i < steps->size; ++i) {
        __bdd_test_step__ *step = steps->values[i];
        if(step->type == __BDD_NODE_TEST__) {
            ++test_count;
        }
    }

    // Outputting the name of the suite
    if (config.use_tap) {
        printf("TAP version 13\n1..%zu\n", test_count);
    }

    config.run = __BDD_TEST_RUN__;

    for (size_t i = 0; i < steps->size; ++i) {
        __bdd_test_step__ *step = steps->values[i];
        config.node_stack->size = 1;
        config.id = 0;
        config.current_test = step;
        __bdd_run__(&config);
    }

    for (size_t i = 0; i < config.nodes->size; ++i) {
        __bdd_node_free__(config.nodes->values[i]);
    }
    root->name = NULL; // name is statically allocated
    __bdd_node_free__(root);
    for (size_t i = 0; i < steps->size; ++i) {
        free(steps->values[i]);
    }
    __bdd_array_free__(config.nodes);
    __bdd_array_free__(config.node_stack);
    __bdd_array_free__(steps);

    if (config.failed_test_count > 0) {
        if (!config.use_tap) {
            printf(
                "\n%zu test%s run, %zu failed.\n",
                test_count, test_count == 1 ? "" : "s", config.failed_test_count
            );
        }
        return 1;
    }
    return 0;
}